

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_CalculateSimpleFeeTest_Test::TestBody
          (ConfidentialTransactionContext_CalculateSimpleFeeTest_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Amount amt;
  ConfidentialTransactionContext tx;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  long *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  char *in_stack_fffffffffffffde8;
  AssertHelper local_1d0;
  Message local_1c8;
  undefined8 local_1c0;
  long *local_1b8;
  AssertionResult local_1b0;
  AssertHelper local_1a0;
  Message local_198;
  char *local_190;
  undefined1 local_188;
  char *local_180;
  undefined1 local_178;
  AssertHelper local_170;
  Message local_168;
  undefined8 local_160;
  undefined8 local_158;
  AssertionResult local_150;
  AssertHelper local_140;
  Message local_138 [2];
  char *local_128;
  undefined1 local_120;
  char *local_118;
  undefined1 local_110;
  char *local_108;
  undefined1 local_100;
  allocator local_e1;
  string local_e0 [32];
  ConfidentialTransactionContext local_c0 [192];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e0,
             "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000"
             ,&local_e1);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(local_c0,local_e0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  cfd::core::Amount::Amount((Amount *)&local_108);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_128 = (char *)cfd::ConfidentialTransactionContext::CalculateSimpleFee
                                    (SUB81(local_c0,0),true);
      local_120 = extraout_DL;
      local_118 = local_128;
      local_110 = extraout_DL;
      local_108 = local_128;
      local_100 = extraout_DL;
    }
  }
  else {
    testing::Message::Message(local_138);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x88,
               "Expected: (amt = tx.CalculateSimpleFee()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_140,local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message((Message *)0x1d59bb);
  }
  local_158 = cfd::core::Amount::GetSatoshiValue();
  local_160 = 1000;
  testing::internal::EqHelper<false>::Compare<long,long>
            (in_stack_fffffffffffffde8,
             (char *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
             in_stack_fffffffffffffdd8,
             (long *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_150);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1d5ab7);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x89,pcVar3);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    testing::Message::~Message((Message *)0x1d5b14);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d5b6c);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      in_stack_fffffffffffffde8 =
           (char *)cfd::ConfidentialTransactionContext::CalculateSimpleFee(SUB81(local_c0,0),false);
      in_stack_fffffffffffffde7 = extraout_DL_00;
      local_190 = in_stack_fffffffffffffde8;
      local_188 = extraout_DL_00;
      local_180 = in_stack_fffffffffffffde8;
      local_178 = extraout_DL_00;
      local_108 = in_stack_fffffffffffffde8;
      local_100 = extraout_DL_00;
    }
  }
  else {
    testing::Message::Message(&local_198);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x8b,
               "Expected: (amt = tx.CalculateSimpleFee(false)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    testing::Message::~Message((Message *)0x1d5cc8);
  }
  local_1b8 = (long *)cfd::core::Amount::GetSatoshiValue();
  local_1c0 = 1000;
  testing::internal::EqHelper<false>::Compare<long,long>
            (in_stack_fffffffffffffde8,
             (char *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),local_1b8,
             (long *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_1c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1d5dbb);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x8c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    testing::Message::~Message((Message *)0x1d5e07);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d5e56);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)CONCAT17(uVar2,in_stack_fffffffffffffdd0));
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, CalculateSimpleFeeTest)
{
    ConfidentialTransactionContext tx(
        "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000");
    Amount amt;
    EXPECT_NO_THROW((amt = tx.CalculateSimpleFee()));
    EXPECT_EQ(amt.GetSatoshiValue(), static_cast<int64_t>(1000));

    EXPECT_NO_THROW((amt = tx.CalculateSimpleFee(false)));
    EXPECT_EQ(amt.GetSatoshiValue(), static_cast<int64_t>(1000));
}